

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Cell.cpp
# Opt level: O3

void __thiscall
Nova::Grid_Iterator_Cell<float,_2>::Grid_Iterator_Cell
          (Grid_Iterator_Cell<float,_2> *this,Grid<float,_2> *grid_input,int number_of_ghost_cells,
          T_Region *region_type,int side)

{
  undefined8 *puVar1;
  T_Region TVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  Range<int,_2> *pRVar8;
  Range<int,_2> *pRVar9;
  uint uVar10;
  bool bVar11;
  int *piVar12;
  Range<int,_2> *pRVar13;
  Range<int,_2> domain;
  Range<int,_2> domain_copy;
  Range<int,_2> local_58;
  _Type local_48;
  _Type local_40;
  int local_34;
  
  (this->super_Grid_Iterator<float,_2>).grid = grid_input;
  (this->super_Grid_Iterator<float,_2>).number_of_regions = 0;
  *(undefined8 *)(this->super_Grid_Iterator<float,_2>).region.min_corner._data._M_elems =
       0x7fffffff7fffffff;
  *(undefined8 *)(this->super_Grid_Iterator<float,_2>).region.max_corner._data._M_elems =
       0x8000000180000001;
  piVar12 = local_48 + 1;
  pRVar13 = (Range<int,_2> *)(local_58.min_corner._data._M_elems + 1);
  lVar7 = 0x20;
  do {
    puVar1 = (undefined8 *)
             ((long)&((Grid_Iterator<float,_2> *)
                     (&(this->super_Grid_Iterator<float,_2>).region + -1))->grid + lVar7);
    *puVar1 = 0x7fffffff7fffffff;
    puVar1[1] = 0x8000000180000001;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x60);
  *(undefined8 *)(this->super_Grid_Iterator<float,_2>).index._data._M_elems = 0;
  if (4 < (uint)side) {
    __assert_fail("side>=0 && side<=2*d",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xe,
                  "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                 );
  }
  TVar2 = *region_type;
  if ((TVar2 & ~Ghost_Region) == Boundary_Region) {
    __assert_fail("(region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xf,
                  "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                 );
  }
  uVar3 = *(undefined8 *)(grid_input->counts)._data._M_elems;
  iVar6 = 1 - number_of_ghost_cells;
  local_40[0] = (int)uVar3 + number_of_ghost_cells;
  local_34 = (int)((ulong)uVar3 >> 0x20) + number_of_ghost_cells;
  local_58.min_corner._data._M_elems[1] = iVar6;
  local_58.min_corner._data._M_elems[0] = iVar6;
  pRVar9 = (Range<int,_2> *)&local_58.max_corner;
  local_58.max_corner._data._M_elems[1] = local_34;
  local_58.max_corner._data._M_elems[0] = local_40[0];
  if (TVar2 == Boundary_Interior_Region) {
    if (side == 0) {
      local_48[0] = iVar6;
      local_48[1] = iVar6;
      local_40[1] = local_34;
      lVar7 = 1;
      bVar5 = true;
      do {
        bVar11 = bVar5;
        local_58.max_corner._data._M_elems[lVar7] = *(int *)pRVar13;
        Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&local_58);
        iVar6 = local_40[lVar7];
        *(int *)pRVar13 = iVar6;
        local_58.max_corner._data._M_elems[lVar7] = iVar6;
        Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&local_58);
        local_58.max_corner._data._M_elems[lVar7] = iVar6 + -1;
        *(int *)pRVar13 = *piVar12 + 1;
        lVar7 = 0;
        piVar12 = local_48;
        pRVar13 = &local_58;
        bVar5 = false;
      } while (bVar11);
      goto LAB_0011df43;
    }
    uVar10 = side - 1U >> 1;
    pRVar8 = pRVar9;
    pRVar13 = &local_58;
    if ((side & 1U) == 0) {
      pRVar8 = &local_58;
      pRVar13 = pRVar9;
    }
    (pRVar8->min_corner)._data._M_elems[uVar10] = (pRVar13->min_corner)._data._M_elems[uVar10];
  }
  else if (TVar2 == Whole_Region) {
    if (side != 0) {
      __assert_fail("!side",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x14,
                    "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                   );
    }
  }
  else {
    if ((number_of_ghost_cells < 1) || (TVar2 != Ghost_Region)) {
      __assert_fail("(region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x2e,
                    "Nova::Grid_Iterator_Cell<float, 2>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 2]"
                   );
    }
    if (side == 0) {
      local_48[0] = local_40[0];
      piVar12 = &local_34;
      lVar7 = 1;
      bVar5 = true;
      do {
        bVar11 = bVar5;
        local_58.max_corner._data._M_elems[lVar7] = 0;
        Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&local_58);
        local_58.max_corner._data._M_elems[lVar7] = *piVar12;
        *(int *)pRVar13 =
             (((this->super_Grid_Iterator<float,_2>).grid)->counts)._data._M_elems[lVar7] + 1;
        Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&local_58);
        local_58.max_corner._data._M_elems[lVar7] =
             (((this->super_Grid_Iterator<float,_2>).grid)->counts)._data._M_elems[lVar7];
        *(int *)pRVar13 = 1;
        lVar7 = 0;
        piVar12 = local_48;
        pRVar13 = &local_58;
        bVar5 = false;
      } while (bVar11);
      goto LAB_0011df43;
    }
    uVar10 = side - 1U >> 1;
    iVar6 = 0;
    if ((side & 1U) == 0) {
      iVar6 = (grid_input->counts)._data._M_elems[uVar10] + 1;
      pRVar9 = &local_58;
    }
    (pRVar9->min_corner)._data._M_elems[uVar10] = iVar6;
  }
  Grid_Iterator<float,_2>::Add_Region(&this->super_Grid_Iterator<float,_2>,&local_58);
LAB_0011df43:
  iVar6 = (this->super_Grid_Iterator<float,_2>).number_of_regions;
  (this->super_Grid_Iterator<float,_2>).valid = 0 < iVar6;
  if (0 < iVar6) {
    (this->super_Grid_Iterator<float,_2>).current_region = 0;
    uVar3 = *(undefined8 *)
             (this->super_Grid_Iterator<float,_2>).regions[0].min_corner._data._M_elems;
    uVar4 = *(undefined8 *)
             (this->super_Grid_Iterator<float,_2>).regions[0].max_corner._data._M_elems;
    *(undefined8 *)(this->super_Grid_Iterator<float,_2>).region.min_corner._data._M_elems = uVar3;
    *(undefined8 *)(this->super_Grid_Iterator<float,_2>).region.max_corner._data._M_elems = uVar4;
    *(undefined8 *)(this->super_Grid_Iterator<float,_2>).index._data._M_elems = uVar3;
  }
  return;
}

Assistant:

Grid_Iterator_Cell<T,d>::
Grid_Iterator_Cell(const Grid<T,d>& grid_input,const int number_of_ghost_cells,const T_Region& region_type,const int side)
    :Base(grid_input)
{
    assert(side>=0 && side<=2*d);
    assert((region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region));
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:               assert(!side);
                                                    Add_Region(domain);
                                                    break;

        case Grid<T,d>::Boundary_Interior_Region:   if(!side)
                                                    {
                                                        Range<int,d> domain_copy(domain);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=domain.min_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain.min_corner(axis)=domain_copy.max_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain_copy.max_corner(axis)-1;
                                                            domain.min_corner(axis)=domain_copy.min_corner(axis)+1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=domain.min_corner(axis);
                                                        else domain.min_corner(axis)=domain.max_corner(axis);
                                                        Add_Region(domain);
                                                    }
                                                    break;

        default:                                    assert((region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0));
                                                    if(!side)
                                                    {
                                                        T_INDEX max_copy(domain.max_corner);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=0;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=max_copy(axis);
                                                            domain.min_corner(axis)=grid.counts(axis)+1;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=grid.counts(axis);
                                                            domain.min_corner(axis)=1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=0;
                                                        else domain.min_corner(axis)=grid.counts(axis)+1;
                                                        Add_Region(domain);
                                                    }
                                                    break;
    }
    Reset();
}